

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

string * __thiscall
t_st_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_st_generator *this,t_type *type,t_const_value *value)

{
  int *piVar1;
  uint uVar2;
  _func_int *p_Var3;
  t_type *type_00;
  __type _Var4;
  int iVar5;
  t_const_value_type tVar6;
  t_type *ptVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  _Base_ptr p_Var9;
  int64_t iVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _func_int **pp_Var12;
  pointer pptVar13;
  char *pcVar14;
  undefined1 auVar15 [12];
  string local_240;
  t_type *local_220;
  string local_218;
  string *local_1f8;
  t_type *local_1f0;
  string local_1e8;
  string local_1c8;
  ostringstream out;
  
  local_1f8 = __return_storage_ptr__;
  ptVar7 = t_type::get_true_type(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[5])(ptVar7);
  if ((char)iVar5 == '\0') {
    iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[10])(ptVar7);
    if ((char)iVar5 == '\0') {
      iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xb])(ptVar7);
      if (((char)iVar5 == '\0') &&
         (iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xc])(ptVar7), (char)iVar5 == '\0')) {
        iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0x10])(ptVar7);
        if ((char)iVar5 == '\0') {
          iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xe])(ptVar7);
          if (((char)iVar5 == '\0') &&
             (iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xf])(ptVar7), (char)iVar5 == '\0')) {
            pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[3])(ptVar7);
            std::operator+(pbVar11,"CANNOT GENERATE CONSTANT FOR TYPE: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_01,iVar5));
            __cxa_throw(pbVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          (*(ptVar7->super_t_doc)._vptr_t_doc[0xe])(ptVar7);
          type_00 = *(t_type **)&ptVar7[1].super_t_doc.has_doc_;
          iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xf])(ptVar7);
          pcVar14 = "(OrderedCollection new";
          if ((char)iVar5 != '\0') {
            pcVar14 = "(Set new";
          }
          poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,pcVar14);
          std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 2;
          for (pptVar13 = (value->listVal_).
                          super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              pptVar13 !=
              (value->listVal_).
              super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
              super__Vector_impl_data._M_finish; pptVar13 = pptVar13 + 1) {
            t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
            poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                                     (string *)&local_240);
            t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
            std::operator<<(poVar8,(string *)&local_218);
            std::__cxx11::string::~string((string *)&local_218);
            std::__cxx11::string::~string((string *)&local_240);
            poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"add: "
                                    );
            render_const_value_abi_cxx11_(&local_240,this,type_00,*pptVar13);
            std::operator<<(poVar8,(string *)&local_240);
            std::__cxx11::string::~string((string *)&local_240);
            poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,";");
            std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
          }
          t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
          poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                                   (string *)&local_240);
          t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
          poVar8 = std::operator<<(poVar8,(string *)&local_218);
          std::operator<<(poVar8,"yourself)");
        }
        else {
          local_220 = *(t_type **)&ptVar7[1].super_t_doc.has_doc_;
          local_1f0 = *(t_type **)&ptVar7[1].annotations_._M_t._M_impl;
          poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                                   "(Dictionary new");
          std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 2;
          for (p_Var9 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var9 != &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
            t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
            poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                                     (string *)&local_240);
            t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
            std::operator<<(poVar8,(string *)&local_218);
            std::__cxx11::string::~string((string *)&local_218);
            std::__cxx11::string::~string((string *)&local_240);
            poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"at: ")
            ;
            render_const_value_abi_cxx11_(&local_240,this,local_220,*(t_const_value **)(p_Var9 + 1))
            ;
            std::operator<<(poVar8,(string *)&local_240);
            std::__cxx11::string::~string((string *)&local_240);
            std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>," put: ");
            render_const_value_abi_cxx11_
                      (&local_240,this,local_1f0,(t_const_value *)p_Var9[1]._M_parent);
            std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                            (string *)&local_240);
            std::__cxx11::string::~string((string *)&local_240);
            poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,";");
            std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
          }
          t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
          poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                                   (string *)&local_240);
          t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
          poVar8 = std::operator<<(poVar8,(string *)&local_218);
          std::operator<<(poVar8,"yourself)");
        }
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_240);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -2;
      }
      else {
        poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"(");
        iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[3])(ptVar7);
        std::__cxx11::string::string((string *)&local_1c8,(string *)CONCAT44(extraout_var,iVar5));
        t_generator::capitalize(&local_240,(t_generator *)this,&local_1c8);
        poVar8 = std::operator<<(poVar8,(string *)&local_240);
        poVar8 = std::operator<<(poVar8," new ");
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_1c8);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        for (p_Var9 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var9 != &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
          pp_Var12 = ptVar7[1].super_t_doc._vptr_t_doc;
          local_220 = (t_type *)0x0;
          for (; pp_Var12 != (_func_int **)ptVar7[1].super_t_doc.doc_._M_dataplus._M_p;
              pp_Var12 = pp_Var12 + 1) {
            p_Var3 = *pp_Var12;
            std::__cxx11::string::string
                      ((string *)&local_240,(string *)(*(long *)(p_Var9 + 1) + 0x48));
            _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(p_Var3 + 0x68),&local_240);
            std::__cxx11::string::~string((string *)&local_240);
            if (_Var4) {
              local_220 = *(t_type **)(*pp_Var12 + 0x60);
            }
          }
          if (local_220 == (t_type *)0x0) {
            pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[3])(ptVar7);
            std::operator+(&local_218,"type error: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_00,iVar5));
            std::operator+(&local_240,&local_218," has no field ");
            std::__cxx11::string::string
                      ((string *)&local_1e8,(string *)(*(long *)(p_Var9 + 1) + 0x48));
            std::operator+(pbVar11,&local_240,&local_1e8);
            __cxa_throw(pbVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
          poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                                   (string *)&local_240);
          std::__cxx11::string::string
                    ((string *)&local_218,(string *)(*(long *)(p_Var9 + 1) + 0x48));
          poVar8 = std::operator<<(poVar8,(string *)&local_218);
          poVar8 = std::operator<<(poVar8,": ");
          render_const_value_abi_cxx11_
                    (&local_1e8,this,local_220,(t_const_value *)p_Var9[1]._M_parent);
          poVar8 = std::operator<<(poVar8,(string *)&local_1e8);
          poVar8 = std::operator<<(poVar8,";");
          std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_240);
        }
        t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
        poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                                 (string *)&local_240);
        std::operator<<(poVar8,"yourself)");
        std::__cxx11::string::~string((string *)&local_240);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
      }
    }
    else {
      poVar8 = t_generator::indent((t_generator *)this,
                                   &out.super_basic_ostream<char,_std::char_traits<char>_>);
      t_const_value::get_integer(value);
      std::ostream::_M_insert<long>((long)poVar8);
    }
  }
  else {
    uVar2 = *(uint *)&ptVar7[1].super_t_doc._vptr_t_doc;
    switch(uVar2) {
    case 1:
      poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,'\"');
      t_generator::get_escaped_string_abi_cxx11_(&local_240,(t_generator *)this,value);
      poVar8 = std::operator<<(poVar8,(string *)&local_240);
      std::operator<<(poVar8,'\"');
      std::__cxx11::string::~string((string *)&local_240);
      break;
    case 2:
      iVar10 = t_const_value::get_integer(value);
      pcVar14 = "false";
      if (0 < iVar10) {
        pcVar14 = "true";
      }
      std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,pcVar14);
      break;
    case 7:
      tVar6 = t_const_value::get_type(value);
      if (tVar6 != CV_INTEGER) {
        std::ostream::_M_insert<double>(value->doubleVal_);
        break;
      }
    case 3:
    case 4:
    case 5:
    case 6:
      t_const_value::get_integer(value);
      std::ostream::_M_insert<long>((long)&out);
      break;
    default:
      auVar15 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_240,(t_base_type *)(ulong)uVar2,auVar15._8_4_);
      std::operator+(auVar15._0_8_,"compiler error: no const of base type ",&local_240);
      __cxa_throw(auVar15._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  return local_1f8;
}

Assistant:

string t_st_generator::render_const_value(t_type* type, t_const_value* value) {
  type = get_true_type(type);
  std::ostringstream out;
  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      out << '"' << get_escaped_string(value) << '"';
      break;
    case t_base_type::TYPE_BOOL:
      out << (value->get_integer() > 0 ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      out << value->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << value->get_integer();
      } else {
        out << value->get_double();
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    indent(out) << value->get_integer();
  } else if (type->is_struct() || type->is_xception()) {
    out << "(" << capitalize(type->get_name()) << " new " << endl;
    indent_up();

    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }

      out << indent() << v_iter->first->get_string() << ": "
          << render_const_value(field_type, v_iter->second) << ";" << endl;
    }
    out << indent() << "yourself)";

    indent_down();
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    out << "(Dictionary new" << endl;
    indent_up();
    indent_up();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      out << indent() << indent();
      out << "at: " << render_const_value(ktype, v_iter->first);
      out << " put: ";
      out << render_const_value(vtype, v_iter->second);
      out << ";" << endl;
    }
    out << indent() << indent() << "yourself)";
    indent_down();
    indent_down();
  } else if (type->is_list() || type->is_set()) {
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    if (type->is_set()) {
      out << "(Set new" << endl;
    } else {
      out << "(OrderedCollection new" << endl;
    }
    indent_up();
    indent_up();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      out << indent() << indent();
      out << "add: " << render_const_value(etype, *v_iter);
      out << ";" << endl;
    }
    out << indent() << indent() << "yourself)";
    indent_down();
    indent_down();
  } else {
    throw "CANNOT GENERATE CONSTANT FOR TYPE: " + type->get_name();
  }
  return out.str();
}